

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O1

void __thiscall
Ptex::v2_4::PtexReader::TiledFaceBase::TiledFaceBase
          (TiledFaceBase *this,PtexReader *reader,Res resArg,Res tileresArg)

{
  DataType DVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  
  (this->super_FaceData)._res = resArg;
  (this->super_FaceData).super_PtexFaceData._vptr_PtexFaceData =
       (_func_int **)&PTR__TiledFaceBase_001178b8;
  this->_reader = reader;
  this->_tileres = tileresArg;
  (this->_tiles).
  super__Vector_base<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_tiles).
  super__Vector_base<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_tiles).
  super__Vector_base<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DVar1 = (reader->_header).datatype;
  this->_dt = DVar1;
  uVar3 = (uint)(reader->_header).nchannels;
  this->_nchan = uVar3;
  this->_pixelsize = uVar3 * *(int *)(DataSize(Ptex::v2_4::DataType)::sizes + (ulong)DVar1 * 4);
  iVar4 = 1 << (resArg.ulog2 - tileresArg.ulog2 & 0x1fU);
  this->_ntilesu = iVar4;
  bVar2 = (this->super_FaceData)._res.vlog2 - tileresArg.vlog2;
  iVar4 = iVar4 << (bVar2 & 0x1f);
  this->_ntilesv = 1 << (bVar2 & 0x1f);
  this->_ntiles = iVar4;
  std::
  vector<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>::
  resize(&this->_tiles,(long)iVar4);
  return;
}

Assistant:

TiledFaceBase(PtexReader* reader, Res resArg, Res tileresArg)
            : FaceData(resArg),
              _reader(reader),
              _tileres(tileresArg)
        {
            _dt = reader->datatype();
            _nchan = reader->nchannels();
            _pixelsize = DataSize(_dt)*_nchan;
            _ntilesu = _res.ntilesu(tileresArg);
            _ntilesv = _res.ntilesv(tileresArg);
            _ntiles = _ntilesu*_ntilesv;
            _tiles.resize(_ntiles);
        }